

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

Vec_Int_t * Abc_SclFindCriticalCoWindow(SC_Man *p,int Window)

{
  float fVar1;
  uint Entry;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar2;
  int i;
  SC_Man *pSVar3;
  float fVar4;
  float fVar5;
  
  pSVar3 = p;
  fVar4 = Abc_SclReadMaxDelay(p);
  p_00 = Vec_IntAlloc((int)pSVar3);
  for (i = 0; i < p->pNtk->vCos->nSize; i = i + 1) {
    pAVar2 = Abc_NtkCo(p->pNtk,i);
    Entry = pAVar2->Id;
    fVar5 = p->pTimes[Entry].rise;
    fVar1 = p->pTimes[Entry].fall;
    if (fVar5 <= fVar1) {
      fVar5 = fVar1;
    }
    if (((100.0 - (float)Window) * fVar4) / 100.0 <= fVar5) {
      Vec_IntPush(p_00,Entry);
    }
  }
  if (0 < p_00->nSize) {
    return p_00;
  }
  __assert_fail("Vec_IntSize(vPivots) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                ,0x6c,"Vec_Int_t *Abc_SclFindCriticalCoWindow(SC_Man *, int)");
}

Assistant:

Vec_Int_t * Abc_SclFindCriticalCoWindow( SC_Man * p, int Window )
{
    float fMaxArr = Abc_SclReadMaxDelay( p ) * (100.0 - Window) / 100.0;
    Vec_Int_t * vPivots;
    Abc_Obj_t * pObj;
    int i;
    vPivots = Vec_IntAlloc( 100 );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        if ( Abc_SclObjTimeMax(p, pObj) >= fMaxArr )
            Vec_IntPush( vPivots, Abc_ObjId(pObj) );
    assert( Vec_IntSize(vPivots) > 0 );
    return vPivots;
}